

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<1u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  Char CVar1;
  int *piVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  int iVar8;
  CharCount CVar9;
  Type *this_00;
  uint uVar10;
  uint uVar12;
  int iVar13;
  int local_38;
  uint local_34;
  int lastOcc;
  ulong uVar11;
  
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar4) goto LAB_00d59376;
    *puVar7 = 0;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar4) {
LAB_00d59376:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (patLen <= inputLength) {
    CVar9 = *inputOffset;
    uVar10 = patLen - 1;
    uVar11 = (ulong)uVar10;
    piVar2 = (this->goodSuffix).ptr;
    this_00 = &this->lastOccurrence;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_34 = inputLength - uVar10;
    for (; CVar9 < local_34; CVar9 = iVar13 + CVar9) {
      while (CVar1 = input[uVar10 + CVar9], pat[uVar11] != CVar1) {
        uVar12 = (uint)(ushort)CVar1;
        if ((ushort)CVar1 < 0x100) {
          BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (this_00,uVar12);
          if (BVar5 == 0) {
            CVar9 = CVar9 + patLen;
            if (local_34 <= CVar9) {
              return false;
            }
          }
          else {
            local_38 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                 (this_00,uVar12);
LAB_00d59275:
            iVar8 = uVar10 - local_38;
            if (iVar8 < piVar2[uVar11]) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                 ,0xeb,
                                 "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                 ,
                                 "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                );
              if (!bVar4) goto LAB_00d59376;
              *puVar7 = 0;
              iVar8 = uVar10 - local_38;
            }
            CVar9 = iVar8 + CVar9;
            if (local_34 <= CVar9) {
              return false;
            }
          }
        }
        else {
          bVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (this_00,uVar12,&local_38);
          if (bVar4) goto LAB_00d59275;
          CVar9 = CVar9 + patLen;
          if (local_34 <= CVar9) {
            return false;
          }
        }
      }
      uVar12 = patLen - 2;
      if (uVar11 == 0) {
LAB_00d59369:
        *inputOffset = CVar9;
        return true;
      }
      while( true ) {
        if (stats != (RegexStats *)0x0) {
          stats->numCompares = stats->numCompares + 1;
        }
        if (pat[uVar12] != input[CVar9 + uVar12]) break;
        uVar12 = uVar12 - 1;
        if ((int)uVar12 < 0) goto LAB_00d59369;
      }
      iVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Get
                        (this_00,input[CVar9 + uVar12]);
      iVar8 = piVar2[(int)uVar12];
      iVar13 = uVar12 - iVar6;
      if ((int)(uVar12 - iVar6) <= iVar8) {
        iVar13 = iVar8;
      }
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }